

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O2

void TranslateWhile(ExpressionTranslateContext *ctx,ExprWhile *expression)

{
  uint uVar1;
  uint uVar2;
  uint loopContinueId;
  uint loopBreakId;
  undefined8 local_38;
  
  uVar1 = ctx->nextLoopBreakId;
  ctx->nextLoopBreakId = uVar1 + 1;
  uVar2 = ctx->nextLoopContinueId;
  ctx->nextLoopContinueId = uVar2 + 1;
  local_38 = CONCAT44(uVar1,uVar2);
  SmallArray<unsigned_int,_32U>::push_back(&ctx->loopBreakIdStack,(uint *)((long)&local_38 + 4));
  SmallArray<unsigned_int,_32U>::push_back(&ctx->loopContinueIdStack,(uint *)&local_38);
  Print(ctx,"while(");
  Translate(ctx,expression->condition);
  Print(ctx,")");
  PrintLine(ctx);
  PrintIndentedLine(ctx,"{");
  ctx->depth = ctx->depth + 1;
  PrintIndent(ctx);
  Translate(ctx,expression->body);
  Print(ctx,";");
  Print(ctx,"continue_%d:;",local_38 & 0xffffffff);
  PrintLine(ctx);
  PrintLine(ctx);
  ctx->depth = ctx->depth - 1;
  PrintIndentedLine(ctx,"}");
  Print(ctx,"break_%d:",local_38 >> 0x20);
  PrintLine(ctx);
  PrintIndent(ctx);
  SmallArray<unsigned_int,_32U>::pop_back(&ctx->loopBreakIdStack);
  SmallArray<unsigned_int,_32U>::pop_back(&ctx->loopContinueIdStack);
  return;
}

Assistant:

void TranslateWhile(ExpressionTranslateContext &ctx, ExprWhile *expression)
{
	unsigned loopBreakId = ctx.nextLoopBreakId++;
	unsigned loopContinueId = ctx.nextLoopContinueId++;
	ctx.loopBreakIdStack.push_back(loopBreakId);
	ctx.loopContinueIdStack.push_back(loopContinueId);

	Print(ctx, "while(");
	Translate(ctx, expression->condition);
	Print(ctx, ")");
	PrintLine(ctx);

	PrintIndentedLine(ctx, "{");
	ctx.depth++;
	PrintIndent(ctx);

	Translate(ctx, expression->body);

	Print(ctx, ";");

	Print(ctx, "continue_%d:;", loopContinueId);
	PrintLine(ctx);

	PrintLine(ctx);
	ctx.depth--;
	PrintIndentedLine(ctx, "}");

	Print(ctx, "break_%d:", loopBreakId);
	PrintLine(ctx);
	PrintIndent(ctx);

	ctx.loopBreakIdStack.pop_back();
	ctx.loopContinueIdStack.pop_back();
}